

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basics.cpp
# Opt level: O0

void observer(uint w)

{
  code *pcVar1;
  byte extraout_AL;
  byte extraout_AL_00;
  int iVar2;
  anon_class_1_0_00000001 *c;
  ResultBuilder *this;
  vector<tf::Task,_std::allocator<tf::Task>_> *this_00;
  Enum EVar3;
  uint in_EDI;
  double __x;
  double __x_00;
  Expression_lhs<const_unsigned_long> EVar4;
  ResultBuilder DOCTEST_RB_1;
  ResultBuilder DOCTEST_RB;
  int j;
  int i_1;
  int i;
  vector<tf::Task,_std::allocator<tf::Task>_> tasks;
  Taskflow taskflowA;
  shared_ptr<tf::ChromeObserver> observer;
  Executor executor;
  Task *in_stack_fffffffffffffb78;
  Result *pRVar5;
  undefined4 in_stack_fffffffffffffb80;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffb84;
  Task *in_stack_fffffffffffffb88;
  int iVar7;
  Taskflow *in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb98;
  Enum in_stack_fffffffffffffb9c;
  Taskflow *in_stack_fffffffffffffba0;
  Executor *in_stack_fffffffffffffbb0;
  unordered_set<std::shared_ptr<tf::ObserverInterface>,_std::hash<std::shared_ptr<tf::ObserverInterface>_>,_std::equal_to<std::shared_ptr<tf::ObserverInterface>_>,_std::allocator<std::shared_ptr<tf::ObserverInterface>_>_>
  *this_01;
  Executor *in_stack_fffffffffffffbe8;
  ExpressionDecomposer local_40c;
  unsigned_long local_408;
  undefined4 in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc04;
  Expression_lhs<const_unsigned_long> *in_stack_fffffffffffffc08;
  undefined8 in_stack_fffffffffffffc68;
  undefined8 in_stack_fffffffffffffc70;
  undefined8 in_stack_fffffffffffffc78;
  ExpressionDecomposer local_33c;
  ResultBuilder *local_338;
  Enum local_330;
  ResultBuilder local_308;
  int local_26c;
  int local_268;
  int local_254;
  Executor local_250;
  
  c = (anon_class_1_0_00000001 *)(ulong)in_EDI;
  this_01 = &local_250._observers;
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)
             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),in_stack_fffffffffffffb78
            );
  tf::Executor::Executor
            ((Executor *)in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
             (shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffc68);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x1270b6);
  tf::Executor::make_observer<tf::ChromeObserver>(in_stack_fffffffffffffbe8);
  tf::Taskflow::Taskflow(in_stack_fffffffffffffba0);
  std::vector<tf::Task,_std::allocator<tf::Task>_>::vector
            ((vector<tf::Task,_std::allocator<tf::Task>_> *)0x1270e9);
  for (local_254 = 0; local_254 < 0x40; local_254 = local_254 + 1) {
    tf::FlowBuilder::
    emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_basics_cpp:999:42),_nullptr>
              ((FlowBuilder *)this_01,c);
    std::vector<tf::Task,_std::allocator<tf::Task>_>::emplace_back<tf::Task>
              ((vector<tf::Task,_std::allocator<tf::Task>_> *)in_stack_fffffffffffffb90,
               in_stack_fffffffffffffb88);
  }
  for (local_268 = 0; iVar7 = local_268, local_268 < 0x40; local_268 = local_268 + 1) {
    while (local_26c = iVar7 + 1, local_26c < 0x40) {
      iVar2 = rand();
      iVar7 = local_26c;
      if (iVar2 % 2 == 0) {
        in_stack_fffffffffffffbb0 = &local_250;
        std::vector<tf::Task,_std::allocator<tf::Task>_>::operator[]
                  ((vector<tf::Task,_std::allocator<tf::Task>_> *)in_stack_fffffffffffffbb0,
                   (long)local_268);
        std::vector<tf::Task,_std::allocator<tf::Task>_>::operator[]
                  ((vector<tf::Task,_std::allocator<tf::Task>_> *)in_stack_fffffffffffffbb0,
                   (long)local_26c);
        tf::Task::precede<tf::Task&>
                  ((Task *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                   in_stack_fffffffffffffb78);
        iVar7 = local_26c;
      }
    }
  }
  tf::Executor::run_n((Executor *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                      in_stack_fffffffffffffb90,(size_t)in_stack_fffffffffffffb88);
  iVar7 = (int)((ulong)in_stack_fffffffffffffb88 >> 0x20);
  std::future<void>::get((future<void> *)in_stack_fffffffffffffb90);
  tf::Future<void>::~Future
            ((Future<void> *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
  pRVar5 = (Result *)0x1ae920;
  doctest::detail::ResultBuilder::ResultBuilder
            ((ResultBuilder *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,
             (char *)in_stack_fffffffffffffb90,iVar7,
             (char *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),"",
             (char *)in_stack_fffffffffffffbb0);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_33c,DT_REQUIRE);
  std::__shared_ptr_access<tf::ChromeObserver,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<tf::ChromeObserver,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x127308);
  tf::ChromeObserver::num_tasks((ChromeObserver *)in_stack_fffffffffffffb90);
  EVar4 = doctest::detail::ExpressionDecomposer::operator<<
                    ((ExpressionDecomposer *)
                     CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                     (unsigned_long *)pRVar5);
  this = (ResultBuilder *)EVar4.lhs;
  EVar3 = EVar4.m_at;
  local_338 = this;
  local_330 = EVar3;
  doctest::detail::Expression_lhs<unsigned_long_const>::operator==
            (in_stack_fffffffffffffc08,
             (int *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
  doctest::detail::ResultBuilder::setResult
            ((ResultBuilder *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),pRVar5);
  doctest::detail::Result::~Result((Result *)0x1273c8);
  doctest::detail::ResultBuilder::log(&local_308,__x);
  if ((extraout_AL & 1) != 0) {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react
            ((ResultBuilder *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
  doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1274c4);
  std::__shared_ptr_access<tf::ChromeObserver,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<tf::ChromeObserver,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1274d3);
  tf::ChromeObserver::clear((ChromeObserver *)in_stack_fffffffffffffb90);
  pRVar5 = (Result *)0x1ae920;
  doctest::detail::ResultBuilder::ResultBuilder
            (this,EVar3,(char *)in_stack_fffffffffffffb90,iVar7,
             (char *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),"",
             (char *)in_stack_fffffffffffffbb0);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_40c,DT_REQUIRE);
  std::__shared_ptr_access<tf::ChromeObserver,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<tf::ChromeObserver,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x127531);
  this_00 = (vector<tf::Task,_std::allocator<tf::Task>_> *)
            tf::ChromeObserver::num_tasks((ChromeObserver *)in_stack_fffffffffffffb90);
  EVar4 = doctest::detail::ExpressionDecomposer::operator<<
                    ((ExpressionDecomposer *)
                     CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                     (unsigned_long *)pRVar5);
  local_408 = EVar4.lhs;
  EVar3 = EVar4.m_at;
  doctest::detail::Expression_lhs<unsigned_long_const>::operator==
            (in_stack_fffffffffffffc08,(int *)CONCAT44(in_stack_fffffffffffffc04,EVar3));
  doctest::detail::ResultBuilder::setResult
            ((ResultBuilder *)CONCAT44(EVar3,in_stack_fffffffffffffb80),pRVar5);
  doctest::detail::Result::~Result((Result *)0x1275d6);
  doctest::detail::ResultBuilder::log((ResultBuilder *)&stack0xfffffffffffffc28,__x_00);
  uVar6 = CONCAT13(extraout_AL_00,(int3)in_stack_fffffffffffffb80);
  if ((extraout_AL_00 & 1) != 0) {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react((ResultBuilder *)CONCAT44(EVar3,uVar6));
  doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1276b5);
  std::vector<tf::Task,_std::allocator<tf::Task>_>::clear
            ((vector<tf::Task,_std::allocator<tf::Task>_> *)0x1276c4);
  std::vector<tf::Task,_std::allocator<tf::Task>_>::~vector(this_00);
  tf::Taskflow::~Taskflow((Taskflow *)CONCAT44(EVar3,uVar6));
  std::shared_ptr<tf::ChromeObserver>::~shared_ptr((shared_ptr<tf::ChromeObserver> *)0x1276eb);
  tf::Executor::~Executor(in_stack_fffffffffffffbb0);
  return;
}

Assistant:

void observer(unsigned w) {

  tf::Executor executor(w);

  auto observer = executor.make_observer<tf::ChromeObserver>();

  tf::Taskflow taskflowA;
  std::vector<tf::Task> tasks;
  // Static tasking
  for(auto i=0; i < 64; i ++) {
    tasks.emplace_back(taskflowA.emplace([](){}));
  }

  // Randomly specify dependency
  for(auto i=0; i < 64; i ++) {
    for(auto j=i+1; j < 64; j++) {
      if(rand()%2 == 0) {
        tasks[i].precede(tasks[j]);
      }
    }
  }

  executor.run_n(taskflowA, 16).get();

  REQUIRE(observer->num_tasks() == 64*16);

  observer->clear();
  REQUIRE(observer->num_tasks() == 0);
  tasks.clear();

}